

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

void Cof_ManInsertEntry_rec(Vec_Ptr_t *vNodes,Cof_Obj_t *pNode,int nNodeMax)

{
  int iVar1;
  Cof_Obj_t *Entry;
  
  iVar1 = vNodes->nSize;
  if (iVar1 != 0) {
    if (iVar1 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    vNodes->nSize = iVar1 - 1U;
    Entry = (Cof_Obj_t *)vNodes->pArray[iVar1 - 1U];
    if (*(uint *)Entry >> 8 < *(uint *)pNode >> 8) {
      Cof_ManInsertEntry_rec(vNodes,pNode,nNodeMax);
      iVar1 = vNodes->nSize;
      pNode = Entry;
    }
    else {
      Vec_PtrPush(vNodes,Entry);
      iVar1 = vNodes->nSize;
    }
    if (nNodeMax <= iVar1) {
      return;
    }
  }
  Vec_PtrPush(vNodes,pNode);
  return;
}

Assistant:

void Cof_ManInsertEntry_rec( Vec_Ptr_t * vNodes, Cof_Obj_t * pNode, int nNodeMax )
{
    Cof_Obj_t * pLast;
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrPush(vNodes, pNode);
        return;
    }
    pLast = (Cof_Obj_t *)Vec_PtrPop(vNodes);
    if ( Cof_ObjFanoutNum(pLast) < Cof_ObjFanoutNum(pNode) )
    {
        Cof_ManInsertEntry_rec( vNodes, pNode, nNodeMax );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pLast );
    }
    else
    {
        Vec_PtrPush( vNodes, pLast );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pNode );
    }
}